

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

mfb_update_state mfb_update_events(mfb_window *window)

{
  long *in_RDI;
  SWindowData_X11 *window_data_x11;
  SWindowData *window_data;
  SWindowData *in_stack_000000a0;
  SWindowData *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = STATE_INVALID_WINDOW;
  }
  else if ((*(byte *)((long)in_RDI + 0x2aa) & 1) == 0) {
    XFlush(*(undefined8 *)(*in_RDI + 8));
    processEvents(in_stack_000000a0);
    local_4 = STATE_OK;
  }
  else {
    destroy_window_data(in_stack_ffffffffffffffe0);
    local_4 = STATE_EXIT;
  }
  return local_4;
}

Assistant:

mfb_update_state
mfb_update_events(struct mfb_window *window) {
    if (window == 0x0) {
        return STATE_INVALID_WINDOW;
    }

    SWindowData *window_data = (SWindowData *) window;
    if (window_data->close) {
        destroy_window_data(window_data);
        return STATE_EXIT;
    }

    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
    XFlush(window_data_x11->display);
    processEvents(window_data);

    return STATE_OK;
}